

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  char cVar1;
  int maxY;
  CompressorScheme CVar2;
  pointer pCVar3;
  pointer ppcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  BaseExc *pBVar10;
  InputExc *this_00;
  size_type *psVar11;
  size_t sVar12;
  pointer pCVar13;
  ushort v;
  long extraout_RDX;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  size_t i;
  pointer pCVar17;
  undefined1 *toNonlinear;
  long lVar18;
  char *pcVar19;
  int byte;
  int y;
  int iVar20;
  bool bVar21;
  reference rVar22;
  char *local_358;
  char *local_350;
  char *local_348;
  char *inDataPtr;
  char *local_320;
  size_t outBufferSize;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  channelRules;
  vector<bool,_std::allocator<bool>_> encodedChannels;
  char *writePtr;
  int local_290;
  int local_28c;
  
  inDataPtr = inPtr;
  local_320 = inPtr;
  initializeDefaultChannelRules(this);
  outBufferSize = 0;
  initializeBuffers(this,&outBufferSize);
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  relevantChannelRules(this,&channelRules);
  lVar8 = ((long)channelRules.
                 super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)channelRules.
                super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  psVar11 = &((channelRules.
               super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
               ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_string_length;
  v = 2;
  while (bVar21 = lVar8 != 0, lVar8 = lVar8 + -1, bVar21) {
    v = v + (short)*psVar11 + 3;
    psVar11 = psVar11 + 6;
  }
  uVar15 = outBufferSize + v;
  outBufferSize = uVar15;
  if (this->_outBufferSize < uVar15) {
    this->_outBufferSize = uVar15;
    if (this->_outBuffer != (char *)0x0) {
      operator_delete__(this->_outBuffer);
    }
    pcVar9 = (char *)operator_new__(uVar15);
    this->_outBuffer = pcVar9;
  }
  else {
    pcVar9 = this->_outBuffer;
  }
  local_348 = this->_packedAcBuffer;
  local_350 = this->_packedDcBuffer;
  uVar14 = (range->max).x;
  if (this->_max[0] < (int)uVar14) {
    uVar14 = this->_max[0];
  }
  sVar12 = (size_t)uVar14;
  iVar6 = (range->min).x;
  iVar20 = (range->min).y;
  maxY = (range->max).y;
  if (this->_max[1] < maxY) {
    maxY = this->_max[1];
  }
  pcVar9[0x48] = '\0';
  pcVar9[0x49] = '\0';
  pcVar9[0x4a] = '\0';
  pcVar9[0x4b] = '\0';
  pcVar9[0x4c] = '\0';
  pcVar9[0x4d] = '\0';
  pcVar9[0x4e] = '\0';
  pcVar9[0x4f] = '\0';
  pcVar9[0x50] = '\0';
  pcVar9[0x51] = '\0';
  pcVar9[0x52] = '\0';
  pcVar9[0x53] = '\0';
  pcVar9[0x54] = '\0';
  pcVar9[0x55] = '\0';
  pcVar9[0x56] = '\0';
  pcVar9[0x57] = '\0';
  pcVar9[0x38] = '\0';
  pcVar9[0x39] = '\0';
  pcVar9[0x3a] = '\0';
  pcVar9[0x3b] = '\0';
  pcVar9[0x3c] = '\0';
  pcVar9[0x3d] = '\0';
  pcVar9[0x3e] = '\0';
  pcVar9[0x3f] = '\0';
  pcVar9[0x40] = '\0';
  pcVar9[0x41] = '\0';
  pcVar9[0x42] = '\0';
  pcVar9[0x43] = '\0';
  pcVar9[0x44] = '\0';
  pcVar9[0x45] = '\0';
  pcVar9[0x46] = '\0';
  pcVar9[0x47] = '\0';
  pcVar9[0x28] = '\0';
  pcVar9[0x29] = '\0';
  pcVar9[0x2a] = '\0';
  pcVar9[0x2b] = '\0';
  pcVar9[0x2c] = '\0';
  pcVar9[0x2d] = '\0';
  pcVar9[0x2e] = '\0';
  pcVar9[0x2f] = '\0';
  pcVar9[0x30] = '\0';
  pcVar9[0x31] = '\0';
  pcVar9[0x32] = '\0';
  pcVar9[0x33] = '\0';
  pcVar9[0x34] = '\0';
  pcVar9[0x35] = '\0';
  pcVar9[0x36] = '\0';
  pcVar9[0x37] = '\0';
  pcVar9[0x18] = '\0';
  pcVar9[0x19] = '\0';
  pcVar9[0x1a] = '\0';
  pcVar9[0x1b] = '\0';
  pcVar9[0x1c] = '\0';
  pcVar9[0x1d] = '\0';
  pcVar9[0x1e] = '\0';
  pcVar9[0x1f] = '\0';
  pcVar9[0x20] = '\0';
  pcVar9[0x21] = '\0';
  pcVar9[0x22] = '\0';
  pcVar9[0x23] = '\0';
  pcVar9[0x24] = '\0';
  pcVar9[0x25] = '\0';
  pcVar9[0x26] = '\0';
  pcVar9[0x27] = '\0';
  pcVar9[8] = '\0';
  pcVar9[9] = '\0';
  pcVar9[10] = '\0';
  pcVar9[0xb] = '\0';
  pcVar9[0xc] = '\0';
  pcVar9[0xd] = '\0';
  pcVar9[0xe] = '\0';
  pcVar9[0xf] = '\0';
  pcVar9[0x10] = '\0';
  pcVar9[0x11] = '\0';
  pcVar9[0x12] = '\0';
  pcVar9[0x13] = '\0';
  pcVar9[0x14] = '\0';
  pcVar9[0x15] = '\0';
  pcVar9[0x16] = '\0';
  pcVar9[0x17] = '\0';
  pcVar9[0] = '\x02';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  pcVar9[4] = '\0';
  pcVar9[5] = '\0';
  pcVar9[6] = '\0';
  pcVar9[7] = '\0';
  *(ulong *)(pcVar9 + 0x50) = (ulong)this->_acCompression;
  setupChannelData(this,iVar6,iVar20,uVar14,maxY);
  local_358 = pcVar9 + (ulong)v + 0x58;
  writePtr = this->_outBuffer + 0x58;
  Xdr::write<Imf_2_5::CharPtrIO,char*>(&writePtr,v);
  lVar8 = 0;
  for (uVar15 = 0;
      uVar15 < (ulong)(((long)channelRules.
                              super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelRules.
                             super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar15 = uVar15 + 1
      ) {
    Classifier::write((Classifier *)
                      ((long)&((channelRules.
                                super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_dataplus.
                              _M_p + lVar8),(int)&writePtr,
                      (void *)(((long)channelRules.
                                      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)channelRules.
                                     super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_start) % 0x30),sVar12);
    lVar8 = lVar8 + 0x30;
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            (&encodedChannels,
             ((long)(this->_channelData).
                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_channelData).
                   super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x98,(allocator_type *)&writePtr);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector(&rowPtrs,((long)(this->_channelData).
                           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_channelData).
                          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x98,
           (allocator_type *)&writePtr);
  uVar14 = 0;
  while( true ) {
    pCVar17 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar13 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pCVar13 - (long)pCVar17) / 0x98) <= (ulong)uVar14) break;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,(ulong)uVar14);
    *rVar22._M_p = *rVar22._M_p & ~rVar22._M_mask;
    uVar14 = uVar14 + 1;
  }
  inDataPtr = local_320;
  for (; iVar20 <= maxY; iVar20 = iVar20 + 1) {
    for (uVar14 = 0; uVar15 = (ulong)uVar14,
        uVar15 < (ulong)(((long)pCVar13 - (long)pCVar17) / 0x98); uVar14 = uVar14 + 1) {
      iVar6 = Imath_2_5::modp(iVar20,pCVar17[uVar15].ySampling);
      if (iVar6 == 0) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (rowPtrs.
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15,&inDataPtr);
        iVar6 = pCVar17[uVar15].width;
        iVar7 = pixelTypeSize(pCVar17[uVar15].type);
        inDataPtr = inDataPtr + (long)iVar7 * (long)iVar6;
      }
      pCVar17 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar13 = (this->_channelData).
                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  inDataPtr = local_320;
  uVar14 = 0;
  while( true ) {
    uVar15 = (ulong)uVar14;
    pCVar3 = (this->_cscSets).
             super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_cscSets).
                       super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0xc) <= uVar15)
    break;
    iVar6 = pCVar3[uVar15].idx[0];
    pCVar17 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    LossyDctEncoderCsc::LossyDctEncoderCsc
              ((LossyDctEncoderCsc *)&writePtr,this->_dwaCompressionLevel / 100000.0,
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar6,
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar3[uVar15].idx[1],
               rowPtrs.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pCVar3[uVar15].idx[2],local_348,local_350
               ,(unsigned_short *)dwaCompressorToNonlinear,pCVar17[iVar6].width,
               pCVar17[iVar6].height,pCVar17[iVar6].type,pCVar17[pCVar3[uVar15].idx[1]].type,
               pCVar17[pCVar3[uVar15].idx[2]].type);
    LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
    lVar18 = (long)local_290;
    *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + lVar18;
    lVar8 = (long)local_28c;
    *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + lVar8;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].idx[0]);
    *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].idx[1]);
    *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&encodedChannels,
                        (long)(this->_cscSets).
                              super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].idx[2]);
    local_348 = local_348 + lVar18 * 2;
    local_350 = local_350 + lVar8 * 2;
    *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
    LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
    uVar14 = uVar14 + 1;
  }
  uVar14 = 0;
  while( true ) {
    uVar15 = (ulong)uVar14;
    pCVar17 = (this->_channelData).
              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar18 = (long)(this->_channelData).
                   super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17;
    lVar8 = lVar18 % 0x98;
    if ((ulong)(lVar18 / 0x98) <= uVar15) break;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,uVar15);
    if ((*rVar22._M_p & rVar22._M_mask) == 0) {
      CVar2 = pCVar17[uVar15].compression;
      if (CVar2 == UNKNOWN) {
        iVar6 = pCVar17[uVar15].width;
        iVar20 = pixelTypeSize(pCVar17[uVar15].type);
        sVar12 = (long)iVar20 * (long)iVar6;
        uVar16 = 0;
        while( true ) {
          ppcVar4 = rowPtrs.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)rowPtrs.
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3) <= (ulong)uVar16
             ) break;
          memcpy(pCVar17[uVar15].planarUncBufferEnd,ppcVar4[uVar16],sVar12);
          pCVar17[uVar15].planarUncBufferEnd = pCVar17[uVar15].planarUncBufferEnd + sVar12;
          uVar16 = uVar16 + 1;
        }
        *(long *)(pcVar9 + 8) = *(long *)(pcVar9 + 8) + (long)pCVar17[uVar15].planarUncSize;
      }
      else if (CVar2 == LOSSY_DCT) {
        toNonlinear = dwaCompressorToNonlinear;
        if (pCVar17[uVar15].pLinear != false) {
          toNonlinear = (undefined1 *)0x0;
        }
        LossyDctEncoder::LossyDctEncoder
                  ((LossyDctEncoder *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                   rowPtrs.
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15,local_348,local_350,
                   (unsigned_short *)toNonlinear,pCVar17[uVar15].width,pCVar17[uVar15].height,
                   pCVar17[uVar15].type);
        LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
        *(long *)(pcVar9 + 0x40) = *(long *)(pcVar9 + 0x40) + (long)local_290;
        *(long *)(pcVar9 + 0x48) = *(long *)(pcVar9 + 0x48) + (long)local_28c;
        local_348 = local_348 + (long)local_290 * 2;
        local_350 = local_350 + (long)local_28c * 2;
        LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
      }
      else if (CVar2 == RLE) {
        uVar16 = 0;
        while( true ) {
          ppcVar4 = rowPtrs.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)rowPtrs.
                            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar15].
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3) <= (ulong)uVar16
             ) break;
          pcVar19 = ppcVar4[uVar16];
          for (iVar6 = 0; iVar20 = pCVar17[uVar15].width, iVar6 < iVar20; iVar6 = iVar6 + 1) {
            for (lVar8 = 0; iVar20 = pixelTypeSize(pCVar17[uVar15].type), lVar8 < iVar20;
                lVar8 = lVar8 + 1) {
              cVar1 = pcVar19[lVar8];
              pcVar5 = pCVar17[uVar15].planarUncRleEnd[lVar8];
              pCVar17[uVar15].planarUncRleEnd[lVar8] = pcVar5 + 1;
              *pcVar5 = cVar1;
            }
            pcVar19 = pcVar19 + lVar8;
          }
          iVar6 = pixelTypeSize(pCVar17[uVar15].type);
          *(long *)(pcVar9 + 0x38) = *(long *)(pcVar9 + 0x38) + (long)(iVar6 * iVar20);
          uVar16 = uVar16 + 1;
        }
      }
      rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[](&encodedChannels,uVar15);
      *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
    }
    uVar14 = uVar14 + 1;
  }
  lVar18 = *(long *)(pcVar9 + 8);
  if (lVar18 != 0) {
    writePtr = (char *)compressBound(lVar18);
    iVar6 = compress2(local_358,&writePtr,this->_planarUncBuffer[0],lVar18,9);
    if (iVar6 != 0) {
      pBVar10 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar10,"Data compression (zlib) failed.");
      __cxa_throw(pBVar10,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    local_358 = local_358 + (long)writePtr;
    *(char **)(pcVar9 + 0x10) = writePtr;
    lVar8 = extraout_RDX;
  }
  lVar18 = *(long *)(pcVar9 + 0x40);
  if (lVar18 == 0) goto LAB_00124900;
  if (this->_acCompression == STATIC_HUFFMAN) {
    iVar6 = hufCompress((unsigned_short *)this->_packedAcBuffer,(int)lVar18,local_358);
    pcVar19 = (char *)(long)iVar6;
LAB_001248f0:
    *(char **)(pcVar9 + 0x18) = pcVar19;
  }
  else {
    if (this->_acCompression == DEFLATE) {
      writePtr = (char *)compressBound(lVar18 * 2,lVar18 * 2,lVar8);
      iVar6 = compress2(local_358,&writePtr,this->_packedAcBuffer,*(long *)(pcVar9 + 0x40) * 2,9);
      pcVar19 = writePtr;
      if (iVar6 != 0) {
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(this_00,"Data compression (zlib) failed.");
        __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      goto LAB_001248f0;
    }
    pcVar19 = *(char **)(pcVar9 + 0x18);
  }
  local_358 = local_358 + (long)pcVar19;
LAB_00124900:
  if (*(long *)(pcVar9 + 0x48) != 0) {
    iVar6 = Zip::compress(this->_zip,this->_packedDcBuffer,(int)*(long *)(pcVar9 + 0x48) * 2,
                          local_358);
    *(long *)(pcVar9 + 0x20) = (long)iVar6;
    local_358 = local_358 + iVar6;
  }
  if (*(long *)(pcVar9 + 0x38) != 0) {
    iVar6 = rleCompress((int)*(long *)(pcVar9 + 0x38),this->_planarUncBuffer[2],this->_rleBuffer);
    *(long *)(pcVar9 + 0x30) = (long)iVar6;
    writePtr = (char *)compressBound();
    iVar6 = compress2(local_358,&writePtr,this->_rleBuffer,*(undefined8 *)(pcVar9 + 0x30),9);
    if (iVar6 != 0) {
      pBVar10 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar10,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar10,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *(char **)(pcVar9 + 0x28) = writePtr;
    local_358 = local_358 + (long)writePtr;
  }
  for (lVar8 = 0; pcVar9 = this->_outBuffer, lVar8 != 0x58; lVar8 = lVar8 + 8) {
    writePtr = pcVar9 + lVar8;
    Xdr::write<Imf_2_5::CharPtrIO,char*>(&writePtr,*(unsigned_long *)(pcVar9 + lVar8));
  }
  *outPtr = pcVar9;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&rowPtrs);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&encodedChannels.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector(&channelRules);
  return ((int)local_358 - (int)pcVar9) + 1;
}

Assistant:

int 
DwaCompressor::compress
    (const char             *inPtr,
     int                    inSize,
     IMATH_NAMESPACE::Box2i range,
     const char             *&outPtr)
{
    const char *inDataPtr   = inPtr;
    char       *packedAcEnd = 0;
    char       *packedDcEnd = 0; 
    int         fileVersion = 2;   // Starting with 2, we write the channel
                                   // classification rules into the file

    if (fileVersion < 2) 
        initializeLegacyChannelRules();
    else 
        initializeDefaultChannelRules();

    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2) 
    {
        relevantChannelRules(channelRules);

        channelRuleSize = Xdr::size<unsigned short>();
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRuleSize += channelRules[i].size();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize) 
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0)
            delete[] _outBuffer;       
        _outBuffer = new char[outBufferSize];
    }

    char *outDataPtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64) +
                                   channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and deferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer)
        packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer)
        packedDcEnd = _packedDcBuffer;

    #define OBIDX(x) (Int64 *)&_outBuffer[x * sizeof (Int64)]

    Int64 *version                 = OBIDX (VERSION);
    Int64 *unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 *unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    Int64 *acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    Int64 *dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    Int64 *rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    Int64 *rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    Int64 *rleRawSize              = OBIDX (RLE_RAW_SIZE);

    Int64 *totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    Int64 *totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    Int64 *acCompression            = OBIDX (AC_COMPRESSION);

    int minX   = range.min.x;
    int maxX   = std::min(range.max.x, _max[0]);
    int minY   = range.min.y;
    int maxY   = std::min(range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (Int64));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;  
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2) 
    {
        char *writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);
        
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRules[i].write(writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size());
    std::vector< std::vector<const char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        encodedChannels[chan] = false;

    inDataPtr =  inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {

            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp(y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back(inDataPtr);
            inDataPtr += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
        }
    }

    inDataPtr = inPtr;

    // 
    // Make a pass over all our CSC sets and try to encode them first
    // 

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {

        LossyDctEncoderCsc encoder
            (_dwaCompressionLevel / 100000.f,
             rowPtrs[_cscSets[csc].idx[0]],
             rowPtrs[_cscSets[csc].idx[1]],
             rowPtrs[_cscSets[csc].idx[2]],
             packedAcEnd,
             packedDcEnd,
             dwaCompressorToNonlinear,
             _channelData[_cscSets[csc].idx[0]].width,
             _channelData[_cscSets[csc].idx[0]].height,
             _channelData[_cscSets[csc].idx[0]].type,
             _channelData[_cscSets[csc].idx[1]].type,
             _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute();

        *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
        *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

        packedAcEnd += encoder.numAcValuesEncoded() * sizeof(unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded() * sizeof(unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        if (encodedChannels[chan])
            continue;

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // For LOSSY_DCT, treat this just like the CSC'd case,
            // but only operate on one channel
            //

            {
                const unsigned short *nonlinearLut = 0;

                if (!cd->pLinear)
                    nonlinearLut = dwaCompressorToNonlinear; 

                LossyDctEncoder encoder
                    (_dwaCompressionLevel / 100000.f,
                     rowPtrs[chan],
                     packedAcEnd,
                     packedDcEnd,
                     nonlinearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                encoder.execute();

                *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
                *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

                packedAcEnd +=
                    encoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcEnd +=
                    encoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For RLE, bash the bytes up so that the first bytes of each
            // pixel are contingous, as are the second bytes, and so on.
            //

            for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
            {
                const char *row = rowPtrs[chan][y];

                for (int x = 0; x < cd->width; ++x)
                {
                    for (int byte = 0;
                         byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                         ++byte)
                    {
                            
                        *cd->planarUncRleEnd[byte]++ = *row++;
                    }
                }

                *rleRawSize += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
            }

            break;

          case UNKNOWN:
           
            //
            // Otherwise, just copy data over verbatim
            //

            {
                int scanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);

                for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
                {
                    memcpy (cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);
    
                    cd->planarUncBufferEnd += scanlineSize;
                }

                *unknownUncompressedSize += cd->planarUncSize;
            }

            break;

          default:

            assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        uLongf inSize  = (uLongf)(*unknownUncompressedSize);
        uLongf outSize = compressBound (inSize);

        if (Z_OK != ::compress2 ((Bytef *)outDataPtr,
                                 &outSize,
                                 (const Bytef *)_planarUncBuffer[UNKNOWN],
                                 inSize,
                                 9))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of 
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    { 
        switch (_acCompression)
        {
          case STATIC_HUFFMAN:

            *acCompressedSize = (int)
                hufCompress((unsigned short *)_packedAcBuffer,
                            (int)*totalAcUncompressedCount,
                            outDataPtr);                
            break;

          case DEFLATE:

            {
                uLongf destLen = compressBound (
                    (*totalAcUncompressedCount) * sizeof (unsigned short));

                if (Z_OK != ::compress2
                                ((Bytef *)outDataPtr,
                                 &destLen,
                                 (Bytef *)_packedAcBuffer, 
                                 (uLong)(*totalAcUncompressedCount
                                                * sizeof (unsigned short)),
                                 9))
                {
                    throw IEX_NAMESPACE::InputExc ("Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;        
            }

            break;

          default:
            
            assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    // 
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress
            (_packedDcBuffer,
             (int)(*totalDcUncompressedCount) * sizeof (unsigned short),
             outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    // 
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //    

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress
            ((int)(*rleRawSize),
             _planarUncBuffer[RLE],
             (signed char *)_rleBuffer);

        uLongf dstLen = compressBound ((uLongf)*rleUncompressedSize);

        if (Z_OK != ::compress2
                        ((Bytef *)outDataPtr, 
                         &dstLen, 
                         (Bytef *)_rleBuffer, 
                         (uLong)(*rleUncompressedSize),
                         9))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }
        
       *rleCompressedSize = dstLen;
        outDataPtr       += *rleCompressedSize;
    }

    // 
    // Flip the counters to XDR format
    //         

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64  src = *(((Int64 *)_outBuffer) + i);
        char  *dst = (char *)(((Int64 *)_outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int>(outDataPtr - _outBuffer + 1);
}